

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O2

bool __thiscall Js::DynamicType::ShareType(DynamicType *this)

{
  Type TVar1;
  DynamicTypeHandler *this_00;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  ScriptContext *scriptContext;
  bool bVar6;
  
  TVar1 = this->isShared;
  iVar4 = (*((this->typeHandler).ptr)->_vptr_DynamicTypeHandler[5])();
  if (TVar1 == true) {
    bVar6 = true;
    if (iVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                  ,0x96,"(this->GetTypeHandler()->IsSharable())",
                                  "this->GetTypeHandler()->IsSharable()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  else if ((iVar4 == 0) || ((((this->typeHandler).ptr)->flags & 8) == 0)) {
    bVar6 = false;
  }
  else {
    LockType(this);
    this_00 = (this->typeHandler).ptr;
    scriptContext = Js::Type::GetScriptContext(&this->super_Type);
    DynamicTypeHandler::ShareTypeHandler(this_00,scriptContext);
    this->isShared = true;
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool DynamicType::ShareType()
    {
        if (this->GetIsShared())
        {
            Assert(this->GetTypeHandler()->IsSharable());
            return true;
        }
        if (this->GetTypeHandler()->IsSharable() && this->GetTypeHandler()->GetMayBecomeShared())
        {
            LockType();
            this->GetTypeHandler()->ShareTypeHandler(this->GetScriptContext());
            this->isShared = true;
            return true;
        }
        return false;
    }